

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::NotMultipleOf(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                *this,int64_t actual,SValue *expected)

{
  ushort uVar1;
  Data local_18;
  
  local_18.s.str = (Ch *)0x96000000000000;
  if (actual < 0) {
    uVar1 = 0xb6;
    if ((ulong)actual < 0xffffffff80000000) goto LAB_001280b8;
  }
  else {
    uVar1 = 0x1f6;
    if ((actual & 0xffffffff80000000U) != 0) {
      uVar1 = (ushort)((ulong)actual >> 0x20 == 0) << 6 | 0x196;
    }
  }
  local_18.s.str = (Ch *)((ulong)uVar1 << 0x30);
LAB_001280b8:
  local_18.n = (Number)actual;
  AddNumberError(this,kValidateErrorMultipleOf,(ValueType *)&local_18.s,expected,
                 (_func_ValueType_ptr *)0x0);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_18.s);
  return;
}

Assistant:

void NotMultipleOf(int64_t actual, const SValue& expected) {
        AddNumberError(kValidateErrorMultipleOf, ValueType(actual).Move(), expected);
    }